

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status
filemgr_read(filemgr *file,bid_t bid,void *buf,err_log_callback *log_callback,
            bool read_on_cache_miss)

{
  ulong uVar1;
  bid_t bVar2;
  int iVar3;
  fdb_status fVar4;
  fdb_status io_error;
  plock_entry_t *plock_entry;
  ulong uVar5;
  __int_type _Var6;
  void *pvVar7;
  uint64_t buflen;
  size_t sVar8;
  char *pcVar9;
  char *format;
  long lVar10;
  plock *plock;
  err_log_callback *log_callback_00;
  long *in_FS_OFFSET;
  bool bVar11;
  char *pcVar12;
  bid_t bid_local;
  void *local_80;
  plock *local_78;
  plock_entry_t *local_70;
  err_log_callback *local_68;
  bid_t is_writer;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  bid_local = bid;
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    pvVar7 = alloc_buf_for_readahead();
    in_FS_OFFSET[-0x1a] = (long)pvVar7;
    *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
  }
  if ((char)in_FS_OFFSET[-0x13] == '\0') {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:2033:31)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:2033:31)>
               ::_M_manager;
    FdbGcFunc::FdbGcFunc((FdbGcFunc *)(*in_FS_OFFSET + -0xc0),(Func *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    __cxa_thread_atexit(FdbGcFunc::~FdbGcFunc,*in_FS_OFFSET + -0xc0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x13) = 1;
  }
  bVar2 = bid_local;
  pcVar9 = (char *)(file->blocksize * bid);
  pcVar12 = (char *)(file->pos).super___atomic_base<unsigned_long>._M_i;
  if (pcVar9 < pcVar12) {
    if (0 < global_config.ncacheblock) {
      is_writer = 0;
      iVar3 = bcache_read(file,bid_local,buf);
      if (iVar3 != 0) {
        return FDB_RESULT_SUCCESS;
      }
      plock = &file->plock;
      local_68 = log_callback;
      plock_entry = plock_lock(plock,&bid_local,&is_writer);
      iVar3 = bcache_read(file,bid_local,buf);
      log_callback_00 = local_68;
      if (iVar3 == 0) {
        local_80 = buf;
        local_78 = plock;
        local_70 = plock_entry;
        if (!read_on_cache_miss) {
          plock_unlock(plock,plock_entry);
          format = 
          "Read error: BID %lu in a database file \'%s\' doesn\'t exist in the cache and read_on_cache_miss flag is turned on.\n"
          ;
          sVar8 = 0x821;
          pcVar12 = file->filename;
          log_callback = local_68;
          pcVar9 = (char *)bid_local;
          goto LAB_00113468;
        }
        lVar10 = 0;
        uVar5 = (file->latest_filesize).super___atomic_base<unsigned_long>._M_i /
                (ulong)file->blocksize;
        while (uVar5 <= bid_local) {
          _Var6 = (*file->ops->goto_eof)(file->fd);
          LOCK();
          (file->latest_filesize).super___atomic_base<unsigned_long>._M_i = _Var6;
          UNLOCK();
          uVar5 = (file->latest_filesize).super___atomic_base<unsigned_long>._M_i /
                  (ulong)file->blocksize;
          bVar11 = lVar10 != 0;
          lVar10 = lVar10 + -1;
          if (bVar11) {
            usleep(1000);
          }
        }
        if (((void *)in_FS_OFFSET[-0x1a] == (void *)0x0) ||
           (global_config.num_blocks_readahead == 0)) {
          uVar5 = filemgr_read_block(file,buf,bid_local);
          plock_entry = local_70;
          plock = local_78;
          if (uVar5 == file->blocksize) {
            fVar4 = _filemgr_crc32_check(file,buf);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              _log_errno_str(file->ops,log_callback_00,fVar4,"READ",file->filename);
              plock_unlock(plock,plock_entry);
              fdb_log_impl(log_callback_00,2,fVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                           ,"filemgr_read",0x85b,
                           "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x\n"
                           ,bid_local,file->filename,
                           (ulong)*(byte *)((long)buf + ((ulong)file->blocksize - 1)));
              if ((log_callback_00 != (err_log_callback *)0x0) &&
                 (log_callback_00->callback != (fdb_log_callback)0x0)) {
                return fVar4;
              }
              buflen = (uint64_t)file->blocksize;
              goto LAB_001135c5;
            }
            if (((global_config.do_not_cache_doc_blocks == true) &&
                (*(char *)((long)buf + ((ulong)file->blocksize - 1)) != -1)) ||
               (io_error = bcache_write(file,bid_local,buf,BCACHE_REQ_CLEAN,false,false),
               io_error == global_config.blocksize)) goto LAB_00113429;
            plock_unlock(plock,plock_entry);
            log_callback_00 = local_68;
            _log_errno_str(file->ops,local_68,io_error,"WRITE",file->filename);
            fVar4 = FDB_RESULT_WRITE_FAIL;
            if (io_error < FDB_RESULT_SUCCESS) {
              fVar4 = io_error;
            }
            fdb_log_impl(log_callback_00,2,fVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                         ,"filemgr_read",0x876,
                         "Read error: BID %lu in a database file \'%s\' is not written in cache correctly: only %d bytes written.\n"
                         ,bid_local,file->filename,(long)io_error);
          }
          else {
            _log_errno_str(file->ops,log_callback_00,(fdb_status)uVar5,"READ",file->filename);
            plock_unlock(plock,plock_entry);
            uVar1 = 0xfffffffffffffffb;
            if ((long)uVar5 < 0) {
              uVar1 = uVar5;
            }
            fVar4 = (fdb_status)uVar1;
            fdb_log_impl(log_callback_00,2,fVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                         ,"filemgr_read",0x849,
                         "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read, file size %zu.\n"
                         ,bid_local,file->filename,uVar5,
                         (file->latest_filesize).super___atomic_base<unsigned_long>._M_i);
          }
          if ((log_callback_00 != (err_log_callback *)0x0) &&
             (log_callback_00->callback != (fdb_log_callback)0x0)) {
            return fVar4;
          }
          buflen = (uint64_t)file->blocksize;
          buf = local_80;
          goto LAB_001135c5;
        }
        fVar4 = filemgr_do_readahead(file,bid_local,buf,(void *)in_FS_OFFSET[-0x1a],log_callback_00)
        ;
        plock_entry = local_70;
        plock = local_78;
        if (fVar4 != FDB_RESULT_SUCCESS) {
          return fVar4;
        }
      }
LAB_00113429:
      plock_unlock(plock,plock_entry);
      return FDB_RESULT_SUCCESS;
    }
    if (read_on_cache_miss) {
      uVar5 = filemgr_read_block(file,buf,bid_local);
      if (uVar5 == file->blocksize) {
        fVar4 = _filemgr_crc32_check(file,buf);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          return FDB_RESULT_SUCCESS;
        }
        _log_errno_str(file->ops,log_callback,fVar4,"READ",file->filename);
        uVar5 = (ulong)*(byte *)((long)buf + ((ulong)file->blocksize - 1));
        sVar8 = 0x8a1;
        pcVar12 = file->filename;
        pcVar9 = 
        "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x (block cache disabled)\n"
        ;
      }
      else {
        _log_errno_str(file->ops,log_callback,(fdb_status)uVar5,"READ",file->filename);
        uVar1 = 0xfffffffffffffffb;
        if ((long)uVar5 < 0) {
          uVar1 = uVar5;
        }
        fVar4 = (fdb_status)uVar1;
        sVar8 = 0x892;
        pcVar12 = file->filename;
        pcVar9 = 
        "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read (block cache disabled).\n"
        ;
      }
      fdb_log_impl(log_callback,2,fVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",sVar8,pcVar9,bVar2,pcVar12,uVar5);
      if ((log_callback != (err_log_callback *)0x0) &&
         (log_callback->callback != (fdb_log_callback)0x0)) {
        return fVar4;
      }
      buflen = (uint64_t)file->blocksize;
LAB_001135c5:
      dbg_print_buf(buf,buflen,true,0x10);
      return fVar4;
    }
    format = "Read error: BID %lu in a database file \'%s\':block cache is not enabled.\n";
    sVar8 = 0x886;
    pcVar12 = file->filename;
    pcVar9 = (char *)bid_local;
  }
  else {
    sVar8 = 0x7fd;
    format = 
    "Read error: read offset %lu exceeds the file\'s current offset %lu in a database file \'%s\'\n"
    ;
  }
LAB_00113468:
  fdb_log_impl(log_callback,2,FDB_RESULT_READ_FAIL,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
               ,"filemgr_read",sVar8,format,pcVar9,pcVar12);
  return FDB_RESULT_READ_FAIL;
}

Assistant:

fdb_status filemgr_read(struct filemgr *file, bid_t bid, void *buf,
                        err_log_callback *log_callback,
                        bool read_on_cache_miss)
{
    thread_local void* buf_aligned = alloc_buf_for_readahead();
    thread_local FdbGcFunc gc([&](){ free_align(buf_aligned); });

    size_t lock_no;
    ssize_t r;
    uint64_t pos = bid * file->blocksize;
    fdb_status status = FDB_RESULT_SUCCESS;
    uint64_t curr_pos = atomic_get_uint64_t(&file->pos);

    if (pos >= curr_pos) {
        const char *msg = "Read error: read offset %" _F64 " exceeds the file's "
                          "current offset %" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, pos, curr_pos, file->filename);
        return FDB_RESULT_READ_FAIL;
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        plock_entry_t *plock_entry = NULL;
        bid_t is_writer = 0;
        bool locked = false; (void)locked;

        r = bcache_read(file, bid, buf);
        if (r == 0) {
            // Cache miss, grab lock and find once again.

            // WARNING:
            //   Regardless of writability, we SHOULD grab lock
            //   as reused blocks are immutable but writers can overwrite it
            //   and can update block cache sooner. Once race condition happens,
            //   reader may overwrite it using previous block.
            plock_entry = plock_lock(&file->plock, &bid, &is_writer);
            locked = true;
            r = bcache_read(file, bid, buf);
        }

        if (r == 0) {
            // Still cache miss, read from file.
            if (!read_on_cache_miss) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                    "doesn't exist in the cache and read_on_cache_miss "
                    "flag is turned on.\n";
                fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                        msg, bid, file->filename);
                return FDB_RESULT_READ_FAIL;
            }

            uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                                    file->blocksize;
            size_t wait_count = 0;
            while (bid >= total_blocks) {
                // This means blocks are asynchronously flushed from cache.
                // Should update file size.
                cs_off_t exp_filesize = file->ops->goto_eof(file->fd);
                atomic_init_uint64_t(&file->latest_filesize, exp_filesize);
                total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                               file->blocksize;
                if (wait_count++) {
                    usleep(1000);
                }
            }

            if ( buf_aligned &&
                 global_config.num_blocks_readahead ) {
                // Direct-IO mode, do read-ahead.
                status = filemgr_do_readahead(file, bid, buf, buf_aligned, log_callback);
                if (status != FDB_RESULT_SUCCESS) return status;

            } else {
                // if normal file, just read a block
                r = filemgr_read_block(file, buf, bid);
                if (r != (ssize_t)file->blocksize) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "READ", file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: BID %" _F64
                        " in a database file '%s' is not read correctly: "
                        "only %d bytes read, file size %zu.\n";
                    status = r < 0 ? (fdb_status)r : FDB_RESULT_READ_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r,
                            atomic_get_uint64_t(&file->latest_filesize));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                status = _filemgr_crc32_check(file, buf);
                if (status != FDB_RESULT_SUCCESS) {
                    _log_errno_str(file->ops, log_callback, status, "READ",
                            file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: checksum error on BID %" _F64
                        " in a database file '%s' : marker %x\n";
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid,
                            file->filename, *((uint8_t*)buf + file->blocksize-1));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
                if ( global_config.do_not_cache_doc_blocks &&
                     marker != BLK_MARKER_BNODE ) {
                    // If caching option is ON, and not a B-tree block,
                    // we do not put it into cache.
                    r = global_config.blocksize;
                } else {
                    r = bcache_write(file, bid, buf, BCACHE_REQ_CLEAN, false, false);
                }

                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "WRITE", file->filename);
                    const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                        "is not written in cache correctly: only %d bytes written.\n";
                    status = r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r);
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }
            }
        }
        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else {
        if (!read_on_cache_miss) {
            const char *msg = "Read error: BID %" _F64 " in a database file '%s':"
                "block cache is not enabled.\n";
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                    msg, bid, file->filename);
            return FDB_RESULT_READ_FAIL;
        }

        r = filemgr_read_block(file, buf, bid);
        if (r != (ssize_t)file->blocksize) {
            _log_errno_str(file->ops, log_callback, (fdb_status) r, "READ",
                           file->filename);
            const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                "is not read correctly: only %d bytes read (block cache disabled).\n";
            status = (r < 0)? (fdb_status)r : FDB_RESULT_READ_FAIL;
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid, file->filename, r);
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

        status = _filemgr_crc32_check(file, buf);
        if (status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ",
                           file->filename);
            const char *msg = "Read error: checksum error on BID %" _F64 " in a database file '%s' "
                ": marker %x (block cache disabled)\n";
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid,
                    file->filename, *((uint8_t*)buf + file->blocksize-1));
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

    }
    return status;
}